

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_features.pb.cc
# Opt level: O3

void __thiscall pb::JavaFeatures::Clear(JavaFeatures *this)

{
  if ((undefined1  [20])((undefined1  [20])this->field_0 & (undefined1  [20])0x1f) !=
      (undefined1  [20])0x0) {
    (this->field_0)._impl_.nest_in_file_class_ = 0;
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void JavaFeatures::Clear() {
// @@protoc_insertion_point(message_clear_start:pb.JavaFeatures)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    ::memset(&_impl_.utf8_validation_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.nest_in_file_class_) -
        reinterpret_cast<char*>(&_impl_.utf8_validation_)) + sizeof(_impl_.nest_in_file_class_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}